

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraCodeLiteGenerator.cxx
# Opt level: O0

string * __thiscall
cmExtraCodeLiteGenerator::GetCleanCommand
          (string *__return_storage_ptr__,cmExtraCodeLiteGenerator *this,cmMakefile *mf,
          string *targetName)

{
  bool bVar1;
  string *psVar2;
  ulong uVar3;
  ostream *poVar4;
  allocator<char> local_239;
  string local_238;
  undefined1 local_218 [8];
  string buildcommand;
  ostringstream ss;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  string generator;
  string *targetName_local;
  cmMakefile *mf_local;
  cmExtraCodeLiteGenerator *this_local;
  
  generator.field_2._8_8_ = targetName;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_GENERATOR",&local_69);
  psVar2 = cmMakefile::GetSafeDefinition(mf,&local_68);
  std::__cxx11::string::string((string *)local_48,(string *)psVar2);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)(buildcommand.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_238,"",&local_239);
  GetBuildCommand((string *)local_218,this,mf,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  uVar3 = std::__cxx11::string::empty();
  if (((uVar3 & 1) == 0) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_48,"Ninja"), bVar1)) {
    poVar4 = std::operator<<((ostream *)((long)&buildcommand.field_2 + 8),(string *)local_218);
    poVar4 = std::operator<<(poVar4," -t clean ");
    std::operator<<(poVar4,(string *)generator.field_2._8_8_);
  }
  else {
    poVar4 = std::operator<<((ostream *)((long)&buildcommand.field_2 + 8),(string *)local_218);
    std::operator<<(poVar4," clean");
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::~string((string *)local_218);
  std::__cxx11::ostringstream::~ostringstream
            ((ostringstream *)(buildcommand.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExtraCodeLiteGenerator::GetCleanCommand(
  const cmMakefile* mf, const std::string& targetName) const
{
  std::string generator = mf->GetSafeDefinition("CMAKE_GENERATOR");
  std::ostringstream ss;
  std::string buildcommand = this->GetBuildCommand(mf, "");
  if (!targetName.empty() && generator == "Ninja") {
    ss << buildcommand << " -t clean " << targetName;
  } else {
    ss << buildcommand << " clean";
  }
  return ss.str();
}